

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Data_Query_PDU::AddVariableDatum(Data_Query_PDU *this,KUINT32 VD)

{
  KUINT16 *pKVar1;
  iterator __position;
  KUINT32 local_c;
  
  __position._M_current =
       (this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_c = VD;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_vVariableDatum,
               __position,&local_c);
  }
  else {
    *__position._M_current = VD;
    (this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  pKVar1 = &(this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + 4;
  this->m_ui32NumVariableDatum = this->m_ui32NumVariableDatum + 1;
  return;
}

Assistant:

void Data_Query_PDU::AddVariableDatum( KUINT32 VD )
{
    m_vVariableDatum.push_back( VD );
    m_ui16PDULength += 4; // Size of KUINT32
    ++m_ui32NumVariableDatum;
}